

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

KeyData * __thiscall
cfd::core::KeyData::DerivePrivkey
          (KeyData *__return_storage_ptr__,KeyData *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path,bool has_rebase_path)

{
  bool bVar1;
  CfdException *this_00;
  size_type sVar2;
  size_type sVar3;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __result;
  undefined1 local_160 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> join_path;
  Privkey local_140;
  Pubkey local_120;
  undefined1 local_108 [8];
  ByteData fp;
  ExtPrivkey key;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  byte local_21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_20;
  bool has_rebase_path_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *path_local;
  KeyData *this_local;
  
  local_21 = has_rebase_path;
  pvStack_20 = path;
  path_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  this_local = __return_storage_ptr__;
  bVar1 = ExtPrivkey::IsValid(&this->extprivkey_);
  if (!bVar1) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x51c;
    local_40.funcname = "DerivePrivkey";
    logger::warn<>(&local_40,"Failed to invalid extPrivkey.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"Failed to invalid extPrivkey.",&local_61);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_60);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ExtPrivkey::DerivePrivkey
            ((ExtPrivkey *)
             &fp.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&this->extprivkey_,path);
  if ((local_21 & 1) == 0) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_160,&this->path_);
    sVar2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_160);
    sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(path);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_160,sVar2 + sVar3);
    __first = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(path);
    __last = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(path);
    __result = ::std::back_inserter<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_160);
    ::std::
    copy<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last._M_current,__result);
    KeyData(__return_storage_ptr__,
            (ExtPrivkey *)
            &fp.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
            (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_160,&this->fingerprint_);
    join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_160);
  }
  else {
    ExtPrivkey::GetPrivkey(&local_140,&this->extprivkey_);
    Privkey::GeneratePubkey(&local_120,&local_140,true);
    Pubkey::GetFingerprint((ByteData *)local_108,&local_120,4);
    Pubkey::~Pubkey(&local_120);
    Privkey::~Privkey(&local_140);
    KeyData(__return_storage_ptr__,
            (ExtPrivkey *)
            &fp.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,path,(ByteData *)local_108);
    join_path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    ByteData::~ByteData((ByteData *)local_108);
  }
  ExtPrivkey::~ExtPrivkey
            ((ExtPrivkey *)
             &fp.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

KeyData KeyData::DerivePrivkey(
    std::vector<uint32_t> path, bool has_rebase_path) const {
  if (!extprivkey_.IsValid()) {
    warn(CFD_LOG_SOURCE, "Failed to invalid extPrivkey.");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Failed to invalid extPrivkey.");
  }
  ExtPrivkey key = extprivkey_.DerivePrivkey(path);
  if (has_rebase_path) {
    auto fp = extprivkey_.GetPrivkey().GeneratePubkey().GetFingerprint();
    return KeyData(key, path, fp);
  } else {
    auto join_path = path_;
    join_path.reserve(join_path.size() + path.size());
    std::copy(path.begin(), path.end(), std::back_inserter(join_path));
    return KeyData(key, join_path, fingerprint_);
  }
}